

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t use_data(rar5 *rar,void **buf,size_t *size,int64_t *offset)

{
  data_ready *pdVar1;
  data_ready *d;
  wchar_t i;
  int64_t *offset_local;
  size_t *size_local;
  void **buf_local;
  rar5 *rar_local;
  
  d._4_4_ = 0;
  while( true ) {
    if (1 < d._4_4_) {
      return L'\xfffffff6';
    }
    pdVar1 = (rar->cstate).dready + d._4_4_;
    if (pdVar1->used != '\0') break;
    d._4_4_ = d._4_4_ + 1;
  }
  if (buf != (void **)0x0) {
    *buf = pdVar1->buf;
  }
  if (size != (size_t *)0x0) {
    *size = pdVar1->size;
  }
  if (offset != (int64_t *)0x0) {
    *offset = pdVar1->offset;
  }
  pdVar1->used = '\0';
  return L'\0';
}

Assistant:

static int use_data(struct rar5* rar, const void** buf, size_t* size,
    int64_t* offset)
{
	int i;

	for(i = 0; i < rar5_countof(rar->cstate.dready); i++) {
		struct data_ready *d = &rar->cstate.dready[i];

		if(d->used) {
			if(buf)    *buf = d->buf;
			if(size)   *size = d->size;
			if(offset) *offset = d->offset;

			d->used = 0;
			return ARCHIVE_OK;
		}
	}

	return ARCHIVE_RETRY;
}